

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_259933::VisitPreset<cmCMakePresetsGraph::WorkflowPreset>
          (WorkflowPreset *preset,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
          *presets,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   *cycleStatus,cmCMakePresetsGraph *graph)

{
  string *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  pointer pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  ReadFileResult RVar4;
  ReadFileResult RVar5;
  int iVar6;
  mapped_type *pmVar7;
  const_iterator cVar8;
  iterator iVar9;
  size_type sVar10;
  _Rb_tree_node_base *p_Var11;
  _Link_type __x;
  pointer __k_00;
  bool bVar12;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_60;
  
  __k = &(preset->super_Preset).Name;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           ::operator[](cycleStatus,__k);
  if (*pmVar7 == InProgress) {
    return CYCLIC_PRESET_INHERITANCE;
  }
  if (*pmVar7 != Verified) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[](cycleStatus,__k);
    *pmVar7 = InProgress;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
    this = &(preset->super_Preset).Environment;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&this->_M_t,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar8._M_node !=
        &(preset->super_Preset).Environment._M_t._M_impl.super__Rb_tree_header) {
      return INVALID_PRESET;
    }
    RVar4 = (*(preset->super_Preset)._vptr_Preset[3])(preset);
    if (RVar4 != READ_OK) {
      return RVar4;
    }
    __k_00 = (preset->super_Preset).Inherits.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (preset->super_Preset).Inherits.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar12 = __k_00 == pbVar1;
    RVar4 = READ_OK;
    if (!bVar12) {
      do {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                ::find(&presets->_M_t,__k_00);
        if ((_Rb_tree_header *)iVar9._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header) {
          RVar4 = INVALID_PRESET;
LAB_001afcf4:
          bVar3 = false;
        }
        else {
          sVar10 = std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(((preset->super_Preset).OriginFile)->ReachableFiles)._M_h,
                           (key_type *)&iVar9._M_node[4]._M_parent);
          if (sVar10 == 0) {
            RVar4 = INHERITED_PRESET_UNREACHABLE_FROM_FILE;
            goto LAB_001afcf4;
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::map(&local_60,cycleStatus);
          __x = (_Link_type)presets;
          RVar5 = VisitPreset<cmCMakePresetsGraph::WorkflowPreset>
                            ((WorkflowPreset *)(iVar9._M_node + 2),presets,&local_60,graph);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
          if ((RVar5 == READ_OK) &&
             (RVar5 = (*(preset->super_Preset)._vptr_Preset[2])
                                (preset,(WorkflowPreset *)(iVar9._M_node + 2)), RVar5 == READ_OK)) {
            for (p_Var11 = *(_Rb_tree_node_base **)(iVar9._M_node + 8);
                p_Var11 != (_Rb_tree_node_base *)&iVar9._M_node[7]._M_left;
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
              ::
              _M_insert_unique<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>const&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(p_Var11 + 1));
            }
            bVar3 = true;
            if ((preset->super_Preset).ConditionEvaluator.
                super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) {
              (preset->super_Preset).ConditionEvaluator.
              super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)iVar9._M_node[6]._M_left;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(preset->super_Preset).ConditionEvaluator.
                          super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar9._M_node[6]._M_right);
            }
          }
          else {
            RVar4 = RVar5;
            bVar3 = false;
          }
        }
        if (!bVar3) break;
        __k_00 = __k_00 + 1;
        bVar12 = __k_00 == pbVar1;
      } while (!bVar12);
    }
    if (!bVar12) {
      return RVar4;
    }
    peVar2 = (preset->super_Preset).ConditionEvaluator.
             super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar6 = (*peVar2->_vptr_Condition[3])(), (char)iVar6 != '\0')) {
      this_00 = (preset->super_Preset).ConditionEvaluator.
                super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (preset->super_Preset).ConditionEvaluator.
      super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (preset->super_Preset).ConditionEvaluator.
      super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    RVar4 = (*(preset->super_Preset)._vptr_Preset[4])
                      (preset,(ulong)(uint)((preset->super_Preset).OriginFile)->Version);
    if (RVar4 != READ_OK) {
      return RVar4;
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[](cycleStatus,__k);
    *pmVar7 = Verified;
  }
  return READ_OK;
}

Assistant:

ReadFileResult VisitPreset(
  T& preset,
  std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  std::map<std::string, CycleStatus> cycleStatus,
  const cmCMakePresetsGraph& graph)
{
  switch (cycleStatus[preset.Name]) {
    case CycleStatus::InProgress:
      return ReadFileResult::CYCLIC_PRESET_INHERITANCE;
    case CycleStatus::Verified:
      return ReadFileResult::READ_OK;
    default:
      break;
  }

  cycleStatus[preset.Name] = CycleStatus::InProgress;

  if (preset.Environment.count("") != 0) {
    return ReadFileResult::INVALID_PRESET;
  }

  CHECK_OK(preset.VisitPresetBeforeInherit());

  for (auto const& i : preset.Inherits) {
    auto parent = presets.find(i);
    if (parent == presets.end()) {
      return ReadFileResult::INVALID_PRESET;
    }

    auto& parentPreset = parent->second.Unexpanded;
    if (!preset.OriginFile->ReachableFiles.count(parentPreset.OriginFile)) {
      return ReadFileResult::INHERITED_PRESET_UNREACHABLE_FROM_FILE;
    }

    auto result = VisitPreset(parentPreset, presets, cycleStatus, graph);
    if (result != ReadFileResult::READ_OK) {
      return result;
    }

    CHECK_OK(preset.VisitPresetInherit(parentPreset));

    for (auto const& v : parentPreset.Environment) {
      preset.Environment.insert(v);
    }

    if (!preset.ConditionEvaluator) {
      preset.ConditionEvaluator = parentPreset.ConditionEvaluator;
    }
  }

  if (preset.ConditionEvaluator && preset.ConditionEvaluator->IsNull()) {
    preset.ConditionEvaluator.reset();
  }

  CHECK_OK(preset.VisitPresetAfterInherit(graph.GetVersion(preset)));

  cycleStatus[preset.Name] = CycleStatus::Verified;
  return ReadFileResult::READ_OK;
}